

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O1

Long amrex::VisMF::Write(FabArray<amrex::FArrayBox> *mf,string *mf_name,How how,bool set_ghost)

{
  size_type *psVar1;
  _Rb_tree_header *p_Var2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  BaseFab<double> *pBVar7;
  pointer piVar8;
  pointer pcVar9;
  FArrayBox *pFVar10;
  long *plVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  RealDescriptor *rd;
  size_type *psVar16;
  Vector<int,_std::allocator<int>_> *pVVar17;
  _Base_ptr p_Var18;
  void *pvVar19;
  double *pdVar20;
  Long LVar21;
  Version comm;
  RealDescriptor *pRVar22;
  int *piVar23;
  int procToWrite;
  DestComp dcomp;
  int iVar24;
  pointer piVar25;
  long lVar26;
  ulong uVar27;
  size_t __n;
  long lVar28;
  size_t __n_00;
  pair<double,_double> pVar29;
  FabArray<amrex::FArrayBox> *the_mf;
  unique_ptr<amrex::RealDescriptor,_std::default_delete<amrex::RealDescriptor>_> whichRD;
  Vector<int,_std::allocator<int>_> procsWithDataVector;
  string filePrefix;
  __string_type tstr;
  MFIter mfi_1;
  set<int,_std::less<int>,_std::allocator<int>_> procsWithData;
  stringstream hss;
  Header hdr;
  NFilesIter nfi;
  long local_790;
  RealDescriptor *local_780;
  char *local_778;
  BATransformer *local_770;
  int local_764;
  void *local_760;
  RealDescriptor *local_758;
  ulong local_750;
  FABio *local_748;
  void *local_740;
  Vector<int,_std::allocator<int>_> local_738;
  string local_720;
  string *local_700;
  long *local_6f8;
  long local_6e8 [2];
  MFIter local_6d8;
  long local_678;
  long local_670;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_668;
  Box local_638 [4];
  RealDescriptor aRStack_5b8 [5];
  Header local_4b0;
  NFilesIter local_388;
  
  local_700 = mf_name;
  FArrayBox::getDataDescriptor();
  pRVar22 = local_780;
  rd = FPC::NativeRealDescriptor();
  bVar12 = RealDescriptor::operator!=(pRVar22,rd);
  if ((set_ghost) &&
     ((*(long *)(mf->super_FabArrayBase).n_grow.vect != 0 ||
      ((mf->super_FabArrayBase).n_grow.vect[2] != 0)))) {
    MFIter::MFIter((MFIter *)&local_388,&mf->super_FabArrayBase,'\0');
    if ((int)local_388.fullFileName._M_string_length <
        (int)local_388.fullFileName.field_2._M_allocated_capacity._0_4_) {
      psVar1 = &local_388.fullFileName._M_string_length;
      local_770 = &(mf->super_FabArrayBase).boxarray.m_bat;
      do {
        if (0 < (mf->super_FabArrayBase).n_comp) {
          dcomp.i = 0;
          lVar26 = (long)*(int *)(*(long *)local_388.filePrefix._M_dataplus._M_p +
                                 (long)(int)local_388.fullFileName._M_string_length * 4) * 0x1c;
          do {
            psVar16 = psVar1;
            if ((long *)local_388.filePrefix._M_string_length != (long *)0x0) {
              psVar16 = (size_type *)
                        ((long)(int)local_388.fullFileName._M_string_length * 4 +
                        *(long *)local_388.filePrefix._M_string_length);
            }
            pBVar7 = &(mf->m_fabs_v).
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[(int)*psVar16]->super_BaseFab<double>
            ;
            BATransformer::operator()
                      (local_638,local_770,
                       (Box *)(*(long *)&(((mf->super_FabArrayBase).boxarray.m_ref.
                                           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->m_abox).
                                         super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                         ._M_impl.super__Vector_impl_data + lVar26));
            pVar29 = BaseFab<double>::minmax<(amrex::RunOn)1>(pBVar7,local_638,dcomp.i);
            local_4b0._0_8_ = (pVar29.second + pVar29.first) * 0.5;
            psVar16 = psVar1;
            if ((long *)local_388.filePrefix._M_string_length != (long *)0x0) {
              psVar16 = (size_type *)
                        ((long)(int)local_388.fullFileName._M_string_length * 4 +
                        *(long *)local_388.filePrefix._M_string_length);
            }
            pBVar7 = &(mf->m_fabs_v).
                      super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[(int)*psVar16]->super_BaseFab<double>
            ;
            BATransformer::operator()
                      (local_638,local_770,
                       (Box *)(*(long *)&(((mf->super_FabArrayBase).boxarray.m_ref.
                                           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->m_abox).
                                         super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                         ._M_impl.super__Vector_impl_data + lVar26));
            BaseFab<double>::setComplement<(amrex::RunOn)1>
                      (pBVar7,(double *)&local_4b0,local_638,dcomp,(NumComps)0x1);
            dcomp.i = dcomp.i + 1;
          } while (dcomp.i < (mf->super_FabArrayBase).n_comp);
        }
        MFIter::operator++((MFIter *)&local_388);
      } while ((int)local_388.fullFileName._M_string_length <
               (int)local_388.fullFileName.field_2._M_allocated_capacity._0_4_);
    }
    MFIter::~MFIter((MFIter *)&local_388);
  }
  pVVar17 = DistributionMapping::ProcessorMap(&(mf->super_FabArrayBase).distributionMap);
  p_Var2 = &local_668._M_impl.super__Rb_tree_header;
  local_668._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_668._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_668._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_738.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (int *)0x0;
  local_738.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_738.super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
  _M_impl.super__Vector_impl_data._M_finish = (int *)0x0;
  piVar25 = (pVVar17->super_vector<int,_std::allocator<int>_>).
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar8 = (pVVar17->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  local_668._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_668._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  if (piVar8 != piVar25 && -1 < (long)piVar8 - (long)piVar25) {
    lVar26 = 0;
    lVar28 = 0;
    do {
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_668,(int *)((long)piVar25 + lVar26));
      lVar28 = lVar28 + 1;
      piVar25 = (pVVar17->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      lVar26 = lVar26 + 4;
    } while (lVar28 < (long)(pVVar17->super_vector<int,_std::allocator<int>_>).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar25 >> 2);
  }
  if (allowSparseWrites == '\0') {
    bVar13 = false;
  }
  else if ((int)local_668._M_impl.super__Rb_tree_header._M_node_count < nOutFiles) {
    bVar13 = true;
    if ((_Rb_tree_header *)local_668._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
      p_Var18 = local_668._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        if (local_738.super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
            == local_738.super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_738,
                     (iterator)
                     local_738.super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish,(int *)(p_Var18 + 1));
        }
        else {
          *local_738.super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
               p_Var18[1]._M_color;
          local_738.super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
               local_738.super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish + 1;
        }
        p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
        bVar13 = true;
      } while ((_Rb_tree_header *)p_Var18 != p_Var2);
    }
  }
  else {
    bVar13 = false;
  }
  Header::Header(&local_4b0,mf,how,currentVersion,false,ParallelDescriptor::m_comm);
  local_720._M_dataplus._M_p = (pointer)&local_720.field_2;
  pcVar9 = (local_700->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_720,pcVar9,pcVar9 + local_700->_M_string_length);
  std::__cxx11::string::append((char *)&local_720);
  NFilesIter::NFilesIter(&local_388,nOutFiles,&local_720,(bool)groupSets,(bool)setBuf);
  local_770 = (BATransformer *)CONCAT44(local_770._4_4_,currentVersion);
  if (bVar13) {
    NFilesIter::SetSparseFPP(&local_388,&local_738);
  }
  else if (useDynamicSetSelection == '\x01') {
    NFilesIter::SetDynamic(&local_388,-1);
  }
  local_764 = 0;
  pRVar22 = aRStack_5b8;
  local_778 = &local_388.field_0x80;
  uVar27 = 0;
  local_758 = pRVar22;
  while( true ) {
    bVar13 = NFilesIter::ReadyToWrite(&local_388,false);
    comm = (Version)pRVar22;
    if (!bVar13) break;
    local_748 = FArrayBox::getFABio();
    iVar14 = RealDescriptor::numBytes(local_780);
    MFIter::MFIter(&local_6d8,&mf->super_FabArrayBase,'\0');
    if (local_6d8.currentIndex < local_6d8.endIndex) {
      iVar24 = 1;
      do {
        piVar23 = &local_6d8.currentIndex;
        if (local_6d8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar23 = ((local_6d8.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_6d8.currentIndex;
        }
        pFVar10 = (mf->m_fabs_v).
                  super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[*piVar23];
        if ((int)local_770 == 1) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_638);
          (*local_748->_vptr_FABio[6])
                    (local_748,local_638[0].bigend.vect + 1,pFVar10,
                     (ulong)(uint)(pFVar10->super_BaseFab<double>).nvar);
          lVar26 = std::ostream::tellp();
          uVar27 = uVar27 + lVar26;
          std::__cxx11::stringstream::~stringstream((stringstream *)local_638);
          std::ios_base::~ios_base((ios_base *)local_758);
        }
        pRVar22 = (RealDescriptor *)
                  ((long)(((pFVar10->super_BaseFab<double>).domain.bigend.vect[0] -
                          (pFVar10->super_BaseFab<double>).domain.smallend.vect[0]) + 1) *
                  (long)iVar14);
        uVar27 = (long)(mf->super_FabArrayBase).n_comp *
                 (long)(((pFVar10->super_BaseFab<double>).domain.bigend.vect[2] -
                        (pFVar10->super_BaseFab<double>).domain.smallend.vect[2]) + 1) *
                 (long)(((pFVar10->super_BaseFab<double>).domain.bigend.vect[1] -
                        (pFVar10->super_BaseFab<double>).domain.smallend.vect[1]) + 1) *
                 (long)pRVar22 + uVar27;
        MFIter::operator++(&local_6d8);
        iVar24 = iVar24 + -1;
      } while (local_6d8.currentIndex < local_6d8.endIndex);
      bVar13 = iVar24 != 0;
    }
    else {
      bVar13 = false;
    }
    MFIter::~MFIter(&local_6d8);
    if ((bVar13 || bVar12) && (useSingleWrite == '\x01')) {
      pvVar19 = operator_new__(uVar27,(nothrow_t *)&std::nothrow);
    }
    else {
      pvVar19 = (void *)0x0;
    }
    local_750 = uVar27;
    if (pvVar19 == (void *)0x0) {
      MFIter::MFIter(&local_6d8,&mf->super_FabArrayBase,'\0');
      if (local_6d8.currentIndex < local_6d8.endIndex) {
        do {
          piVar23 = &local_6d8.currentIndex;
          if (local_6d8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar23 = ((local_6d8.local_index_map)->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start + local_6d8.currentIndex;
          }
          pBVar7 = &(mf->m_fabs_v).
                    super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[*piVar23]->super_BaseFab<double>;
          iVar24 = (pBVar7->domain).bigend.vect[0];
          iVar3 = (pBVar7->domain).smallend.vect[0];
          iVar4 = (pBVar7->domain).bigend.vect[1];
          iVar5 = (pBVar7->domain).smallend.vect[1];
          iVar6 = (pBVar7->domain).bigend.vect[2];
          iVar15 = (pBVar7->domain).smallend.vect[2];
          pvVar19 = (void *)(long)(mf->super_FabArrayBase).n_comp;
          if ((int)local_770 == 1) {
            local_760 = pvVar19;
            std::__cxx11::stringstream::stringstream((stringstream *)local_638);
            (*local_748->_vptr_FABio[6])
                      (local_748,local_638[0].bigend.vect + 1,pBVar7,(ulong)(uint)pBVar7->nvar);
            std::ostream::tellp();
            std::__cxx11::stringbuf::str();
            std::ostream::write(local_778,(long)local_6f8);
            std::ostream::flush();
            if (local_6f8 != local_6e8) {
              operator_delete(local_6f8,local_6e8[0] + 1);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_638);
            std::ios_base::~ios_base((ios_base *)local_758);
            pvVar19 = local_760;
          }
          pRVar22 = (RealDescriptor *)((long)((iVar4 - iVar5) + 1) * (long)((iVar24 - iVar3) + 1));
          lVar26 = (long)((iVar6 - iVar15) + 1) * (long)pvVar19 * (long)pRVar22;
          pdVar20 = BaseFab<double>::dataPtr(pBVar7,0);
          if (bVar12) {
            pvVar19 = operator_new__(lVar26 * iVar14);
            uVar27 = local_750;
            pRVar22 = local_780;
            RealDescriptor::convertFromNativeFormat(pvVar19,lVar26,pdVar20,local_780);
            std::ostream::write(local_778,(long)pvVar19);
            std::ostream::flush();
            operator_delete__(pvVar19);
          }
          else {
            std::ostream::write(local_778,(long)pdVar20);
            uVar27 = local_750;
            std::ostream::flush();
          }
          MFIter::operator++(&local_6d8);
        } while (local_6d8.currentIndex < local_6d8.endIndex);
      }
      MFIter::~MFIter(&local_6d8);
    }
    else {
      MFIter::MFIter(&local_6d8,&mf->super_FabArrayBase,'\0');
      if (local_6d8.currentIndex < local_6d8.endIndex) {
        local_678 = (long)iVar14;
        local_790 = 0;
        local_740 = pvVar19;
        do {
          piVar23 = &local_6d8.currentIndex;
          if (local_6d8.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
            piVar23 = ((local_6d8.local_index_map)->super_vector<int,_std::allocator<int>_>).
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start + local_6d8.currentIndex;
          }
          pBVar7 = &(mf->m_fabs_v).
                    super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[*piVar23]->super_BaseFab<double>;
          iVar14 = (pBVar7->domain).bigend.vect[0];
          iVar24 = (pBVar7->domain).bigend.vect[1];
          iVar3 = (pBVar7->domain).smallend.vect[0];
          iVar4 = (pBVar7->domain).smallend.vect[1];
          iVar5 = (pBVar7->domain).bigend.vect[2];
          iVar6 = (pBVar7->domain).smallend.vect[2];
          local_670 = (long)(mf->super_FabArrayBase).n_comp;
          local_760 = (void *)((long)local_740 + local_790);
          if ((int)local_770 == 1) {
            std::__cxx11::stringstream::stringstream((stringstream *)local_638);
            (*local_748->_vptr_FABio[6])
                      (local_748,local_638[0].bigend.vect + 1,pBVar7,(ulong)(uint)pBVar7->nvar);
            iVar15 = std::ostream::tellp();
            std::__cxx11::stringbuf::str();
            plVar11 = local_6f8;
            __n = (size_t)iVar15;
            memcpy(local_760,local_6f8,__n);
            if (plVar11 != local_6e8) {
              operator_delete(plVar11,local_6e8[0] + 1);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_638);
            std::ios_base::~ios_base((ios_base *)local_758);
          }
          else {
            __n = 0;
          }
          pRVar22 = (RealDescriptor *)((long)((iVar24 - iVar4) + 1) * (long)((iVar14 - iVar3) + 1));
          lVar26 = ((iVar5 - iVar6) + 1) * local_670 * (long)pRVar22;
          __n_00 = lVar26 * local_678;
          pdVar20 = BaseFab<double>::dataPtr(pBVar7,0);
          if (bVar12) {
            pRVar22 = local_780;
            RealDescriptor::convertFromNativeFormat
                      ((void *)((long)local_760 + __n),lVar26,pdVar20,local_780);
          }
          else {
            memcpy((void *)((long)local_760 + __n),pdVar20,__n_00);
          }
          pvVar19 = local_740;
          local_790 = __n_00 + local_790 + __n;
          MFIter::operator++(&local_6d8);
          uVar27 = local_750;
        } while (local_6d8.currentIndex < local_6d8.endIndex);
      }
      MFIter::~MFIter(&local_6d8);
      std::ostream::write(local_778,(long)pvVar19);
      std::ostream::flush();
      operator_delete__(pvVar19);
    }
    NFilesIter::operator++(&local_388);
  }
  if (local_388.useStaticSetSelection == false) {
    local_764 = local_388.coordinatorProc;
  }
  if ((currentVersion & ~NoFabHeader_v1) == Version_v1) {
    Header::CalculateMinMax(&local_4b0,mf,procToWrite,comm);
  }
  FindOffsets(mf,&local_720,&local_4b0,comm,&local_388,ParallelDescriptor::m_comm);
  LVar21 = WriteHeader(local_700,&local_4b0,local_764,comm);
  NFilesIter::~NFilesIter(&local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_720._M_dataplus._M_p != &local_720.field_2) {
    operator_delete(local_720._M_dataplus._M_p,local_720.field_2._M_allocated_capacity + 1);
  }
  Header::~Header(&local_4b0);
  if (local_738.super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_738.super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_738.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_738.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_668);
  if (local_780 != (RealDescriptor *)0x0) {
    std::default_delete<amrex::RealDescriptor>::operator()
              ((default_delete<amrex::RealDescriptor> *)&local_780,local_780);
  }
  return LVar21 + uVar27;
}

Assistant:

Long
VisMF::Write (const FabArray<FArrayBox>&    mf,
              const std::string& mf_name,
              VisMF::How         how,
              bool               set_ghost)
{
    BL_PROFILE("VisMF::Write(FabArray)");
    BL_ASSERT(mf_name[mf_name.length() - 1] != '/');
    BL_ASSERT(currentVersion != VisMF::Header::Undefined_v1);

    // ---- add stream retry
    // ---- add stream buffer (to nfiles)
    auto whichRD = FArrayBox::getDataDescriptor();
    bool doConvert(*whichRD != FPC::NativeRealDescriptor());

    if(set_ghost && mf.nGrowVect() != 0) {
        FabArray<FArrayBox>* the_mf = const_cast<FabArray<FArrayBox>*>(&mf);

        bool run_on_device = Gpu::inLaunchRegion()
            && (mf.arena()->isManaged() || mf.arena()->isDevice());

        for(MFIter mfi(*the_mf); mfi.isValid(); ++mfi) {
            const int idx(mfi.index());

            for(int j(0); j < mf.nComp(); ++j) {
                auto mm = (run_on_device) ? mf[mfi].minmax<RunOn::Device>(mf.box(idx),j)
                                          : mf[mfi].minmax<RunOn::Host  >(mf.box(idx),j);
                const Real val = (mm.first + mm.second) / 2.0_rt;
                if (run_on_device) {
                    the_mf->get(mfi).setComplement<RunOn::Device>(val, mf.box(idx), j, 1);
                } else {
                    the_mf->get(mfi).setComplement<RunOn::Host>(val, mf.box(idx), j, 1);
                }
            }
        }
    }

    // ---- check if mf has sparse data
    bool useSparseFPP(false);
    const Vector<int> &pmap = mf.DistributionMap().ProcessorMap();
    std::set<int> procsWithData;
    Vector<int> procsWithDataVector;
    for(int i(0); i < pmap.size(); ++i) {
      procsWithData.insert(pmap[i]);
    }
    if(allowSparseWrites && (static_cast<int>(procsWithData.size()) < nOutFiles)) {
      useSparseFPP = true;
//      amrex::Print() << "SSSSSSSS:  in VisMF::Write:  useSparseFPP for:  " << mf_name << '\n';
      for(std::set<int>::iterator it = procsWithData.begin(); it != procsWithData.end(); ++it) {
        procsWithDataVector.push_back(*it);
      }
    }

    int coordinatorProc(ParallelDescriptor::IOProcessorNumber());
    Long bytesWritten(0);
    bool calcMinMax(false);
    VisMF::Header hdr(mf, how, currentVersion, calcMinMax);

    std::string filePrefix(mf_name + FabFileSuffix);

    NFilesIter nfi(nOutFiles, filePrefix, groupSets, setBuf);

    bool oldHeader(currentVersion == VisMF::Header::Version_v1);

    if(useSparseFPP) {
        nfi.SetSparseFPP(procsWithDataVector);
    } else if(useDynamicSetSelection) {
        nfi.SetDynamic();
    }
    for( ; nfi.ReadyToWrite(); ++nfi) {
        // ---- find the total number of bytes including fab headers if needed
        const FABio &fio = FArrayBox::getFABio();
        int whichRDBytes(whichRD->numBytes()), nFABs(0);
        Long writeDataItems(0), writeDataSize(0);
        for(MFIter mfi(mf); mfi.isValid(); ++mfi) {
            const FArrayBox &fab = mf[mfi];
            if(oldHeader) {
                std::stringstream hss;
                fio.write_header(hss, fab, fab.nComp());
                bytesWritten += static_cast<std::streamoff>(hss.tellp());
            }
            bytesWritten += fab.box().numPts() * mf.nComp() * whichRDBytes;
            ++nFABs;
        }
        char *allFabData(nullptr);
        bool canCombineFABs(false);
        if((nFABs > 1 || doConvert) && VisMF::useSingleWrite) {
            allFabData = new(std::nothrow) char[bytesWritten];
        }    // ---- else { no need to make a copy for one fab }
        if(allFabData == nullptr) {
            canCombineFABs = false;
        } else {
            canCombineFABs = true;
        }

        if(canCombineFABs) {
            Long writePosition(0);
            for(MFIter mfi(mf); mfi.isValid(); ++mfi) {
                int hLength(0);
                const FArrayBox &fab = mf[mfi];
                writeDataItems = fab.box().numPts() * mf.nComp();
                writeDataSize = writeDataItems * whichRDBytes;
                char *afPtr = allFabData + writePosition;
                if(oldHeader) {
                    std::stringstream hss;
                    fio.write_header(hss, fab, fab.nComp());
                    hLength = static_cast<std::streamoff>(hss.tellp());
                    auto tstr = hss.str();
                    std::memcpy(afPtr, tstr.c_str(), hLength);  // ---- the fab header
                }
                Real const* fabdata = fab.dataPtr();
#ifdef AMREX_USE_GPU
                std::unique_ptr<FArrayBox> hostfab;
                if (fab.arena()->isManaged() || fab.arena()->isDevice()) {
                    hostfab = std::make_unique<FArrayBox>(fab.box(), fab.nComp(),
                                                          The_Pinned_Arena());
                    Gpu::dtoh_memcpy_async(hostfab->dataPtr(), fab.dataPtr(),
                                           fab.size()*sizeof(Real));
                    Gpu::streamSynchronize();
                    fabdata = hostfab->dataPtr();
                }
#endif
                if(doConvert) {
                    RealDescriptor::convertFromNativeFormat(static_cast<void *> (afPtr + hLength),
                                                            writeDataItems,
                                                            fabdata, *whichRD);
                } else {    // ---- copy from the fab
                    memcpy(afPtr + hLength, fabdata, writeDataSize);
                }
                writePosition += hLength + writeDataSize;
            }
            nfi.Stream().write(allFabData, bytesWritten);
            nfi.Stream().flush();
            delete [] allFabData;

        } else {    // ---- write fabs individually
            for(MFIter mfi(mf); mfi.isValid(); ++mfi) {
                int hLength(0);
                const FArrayBox &fab = mf[mfi];
                writeDataItems = fab.box().numPts() * mf.nComp();
                writeDataSize = writeDataItems * whichRDBytes;
                if(oldHeader) {
                    std::stringstream hss;
                    fio.write_header(hss, fab, fab.nComp());
                    hLength = static_cast<std::streamoff>(hss.tellp());
                    auto tstr = hss.str();
                    nfi.Stream().write(tstr.c_str(), hLength);    // ---- the fab header
                    nfi.Stream().flush();
                }
                Real const* fabdata = fab.dataPtr();
#ifdef AMREX_USE_GPU
                std::unique_ptr<FArrayBox> hostfab;
                if (fab.arena()->isManaged() || fab.arena()->isDevice()) {
                    hostfab = std::make_unique<FArrayBox>(fab.box(), fab.nComp(),
                                                          The_Pinned_Arena());
                    Gpu::dtoh_memcpy_async(hostfab->dataPtr(), fab.dataPtr(),
                                           fab.size()*sizeof(Real));
                    Gpu::streamSynchronize();
                    fabdata = hostfab->dataPtr();
                }
#endif
                if(doConvert) {
                    char *cDataPtr = new char[writeDataSize];
                    RealDescriptor::convertFromNativeFormat(static_cast<void *> (cDataPtr),
                                                            writeDataItems,
                                                            fabdata, *whichRD);
                    nfi.Stream().write(cDataPtr, writeDataSize);
                    nfi.Stream().flush();
                    delete [] cDataPtr;
                } else {    // ---- copy from the fab
                    nfi.Stream().write((char *) fabdata, writeDataSize);
                    nfi.Stream().flush();
                }
            }
        }
    }

    if(nfi.GetDynamic()) {
        coordinatorProc = nfi.CoordinatorProc();
    }

    if(currentVersion == VisMF::Header::Version_v1 ||
       currentVersion == VisMF::Header::NoFabHeaderMinMax_v1)
    {
        hdr.CalculateMinMax(mf, coordinatorProc);
    }

    VisMF::FindOffsets(mf, filePrefix, hdr, currentVersion, nfi,
                       ParallelDescriptor::Communicator());

    bytesWritten += VisMF::WriteHeader(mf_name, hdr, coordinatorProc);

    return bytesWritten;
}